

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

logical pnga_update2_ghosts(Integer g_a)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  char **ppcVar5;
  char *pcVar6;
  C_Integer *pCVar7;
  char *pcVar8;
  bool bVar9;
  global_array_t *pgVar10;
  int iVar11;
  Integer proc;
  logical lVar12;
  Integer *map;
  ulong *proclist;
  long lVar13;
  size_t sVar14;
  Integer IVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  C_Integer CVar24;
  long lVar25;
  int _ndim;
  ulong proc_00;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int _ndim_4;
  ulong uVar30;
  Integer _last;
  long lVar31;
  int local_5a8;
  int local_5a0;
  int _index [7];
  Integer _hi [7];
  Integer np;
  int stride_rem [7];
  int stride_loc [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer width [7];
  int count [7];
  Integer plo_loc [7];
  char err_string [256];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer phi_loc [7];
  Integer mask [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer plo_rem [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar12 = pnga_has_ghosts(g_a);
  if (lVar12 != 0) {
    lVar12 = gai_check_ghost_distr(g_a);
    if (lVar12 == 0) {
      return 0;
    }
    map = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (map == (Integer *)0x0) {
      pnga_error("pnga_update2_ghosts:malloc failed (_ga_map)",0);
    }
    lVar25 = g_a + 1000;
    proclist = (ulong *)malloc(GAnproc << 3);
    if (proclist == (ulong *)0x0) {
      pnga_error("pnga_update2_ghosts:malloc failed (_ga_proclist)",0);
    }
    pgVar10 = GA;
    iVar3 = GA[lVar25].elemsize;
    sVar1 = GA[lVar25].ndim;
    lVar31 = (long)sVar1;
    iVar4 = GA[lVar25].p_handle;
    if (0 < lVar31) {
      memcpy(width,GA[g_a + 1000].width,lVar31 * 8);
      memcpy(dims,pgVar10[g_a + 1000].dims,lVar31 * 8);
    }
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    lVar29 = 1;
    lVar13 = lVar31;
    if (0 < sVar1) {
      do {
        lVar29 = lVar29 * 3;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    local_5a8 = (int)proc;
    lVar13 = 0;
    do {
      if (0 < sVar1) {
        bVar9 = true;
        lVar28 = 0;
        lVar18 = lVar13;
        do {
          lVar21 = ~((lVar18 / 3) * 3) + lVar18;
          if (lVar21 != 0) {
            bVar9 = false;
          }
          mask[lVar28] = lVar21;
          lVar28 = lVar28 + 1;
          lVar18 = lVar18 / 3;
        } while (lVar31 != lVar28);
        if (!bVar9) {
          if (0 < sVar1) {
            lVar18 = 0;
            bVar9 = false;
            do {
              if ((mask[lVar18] != 0) && (width[lVar18] == 0)) {
                bVar9 = true;
              }
              lVar18 = lVar18 + 1;
            } while (lVar31 != lVar18);
            if (bVar9) goto LAB_0017c4ef;
          }
          if (0 < sVar1) {
            lVar18 = 0;
            do {
              lVar28 = mask[lVar18];
              if (lVar28 == -1) {
                lVar28 = lo_loc[lVar18];
                if (1 < lVar28) {
                  tlo_rem[lVar18] = lVar28 - width[lVar18];
                  lVar28 = lVar28 + -1;
                  goto LAB_0017b80f;
                }
                thi_rem[lVar18] = dims[lVar18];
                tlo_rem[lVar18] = (dims[lVar18] - width[lVar18]) + 1;
              }
              else {
                if (lVar28 == 1) {
                  lVar28 = hi_loc[lVar18];
                  if (lVar28 < dims[lVar18]) {
                    tlo_rem[lVar18] = lVar28 + 1;
                    lVar28 = lVar28 + width[lVar18];
                  }
                  else {
                    tlo_rem[lVar18] = 1;
                    lVar28 = width[lVar18];
                  }
                }
                else {
                  if (lVar28 != 0) {
                    pnga_update2_ghosts_cold_1();
                    goto LAB_0017b817;
                  }
                  tlo_rem[lVar18] = lo_loc[lVar18];
                  lVar28 = hi_loc[lVar18];
                }
LAB_0017b80f:
                thi_rem[lVar18] = lVar28;
              }
LAB_0017b817:
              lVar18 = lVar18 + 1;
            } while (lVar31 != lVar18);
          }
          lVar12 = pnga_locate_region(g_a,tlo_rem,thi_rem,map,(Integer *)proclist,&np);
          if (lVar12 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA[lVar25].name);
            sVar14 = strlen(err_string);
            sprintf(err_string + (int)sVar14," [%ld:%ld ",tlo_rem[0],thi_rem[0]);
            sVar14 = strlen(err_string);
            iVar11 = (int)sVar14;
            IVar15 = pnga_ndim(g_a);
            if (1 < IVar15) {
              lVar18 = 1;
              do {
                sprintf(err_string + (int)sVar14,",%ld:%ld ",tlo_rem[lVar18],thi_rem[lVar18]);
                sVar14 = strlen(err_string);
                iVar11 = (int)sVar14;
                lVar18 = lVar18 + 1;
                IVar15 = pnga_ndim(g_a);
              } while (lVar18 < IVar15);
            }
            (err_string + iVar11)[0] = ']';
            (err_string + iVar11)[1] = '\0';
            pnga_error(err_string,g_a);
          }
          if (1 < np) {
            pnga_update2_ghosts_cold_2();
          }
          proc_00 = *proclist;
          pnga_distribution(g_a,proc_00,tlo_rem,thi_rem);
          pgVar10 = GA;
          if (0 < sVar1) {
            lVar18 = 0;
            do {
              lVar28 = mask[lVar18];
              if (lVar28 == -1) {
                lVar28 = width[lVar18];
                plo_loc[lVar18] = lVar28;
                phi_loc[lVar18] = lVar28 * 2 + -1;
                lVar28 = ((lVar28 + thi_rem[lVar18]) - tlo_rem[lVar18]) + 1;
LAB_0017ba89:
                plo_rem[lVar18] = lVar28;
              }
              else {
                if (lVar28 == 1) {
                  plo_loc[lVar18] = (hi_loc[lVar18] - lo_loc[lVar18]) + 1;
                  phi_loc[lVar18] = (hi_loc[lVar18] - lo_loc[lVar18]) + width[lVar18];
                  lVar28 = 0;
                  goto LAB_0017ba89;
                }
                if (lVar28 == 0) {
                  lVar28 = width[lVar18];
                  plo_loc[lVar18] = lVar28;
                  phi_loc[lVar18] = (hi_loc[lVar18] + lVar28) - lo_loc[lVar18];
                  goto LAB_0017ba89;
                }
              }
              lVar18 = lVar18 + 1;
            } while (lVar31 != lVar18);
          }
          uVar2 = GA[lVar25].ndim;
          uVar30 = (ulong)(short)uVar2;
          iVar11 = GA[lVar25].distr_type;
          if (iVar11 - 1U < 3) {
            uVar22 = (long)local_5a8 % GA[lVar25].num_blocks[0];
            _index[0] = (int)uVar22;
            if (1 < (short)uVar2) {
              uVar22 = uVar22 & 0xffffffff;
              lVar18 = 0;
              IVar15 = proc;
              do {
                IVar15 = (long)((int)IVar15 - (int)uVar22) / GA[g_a + 1000].num_blocks[lVar18];
                uVar22 = (long)(int)IVar15 % GA[g_a + 1000].num_blocks[lVar18 + 1];
                _index[lVar18 + 1] = (int)uVar22;
                lVar18 = lVar18 + 1;
              } while ((uVar30 & 0xffffffff) - 1 != lVar18);
            }
            if (0 < (short)uVar2) {
              lVar18 = 0;
              do {
                iVar20 = *(int *)((long)_index + lVar18);
                lVar28 = *(long *)((long)GA[g_a + 1000].block_dims + lVar18 * 2);
                *(long *)(err_string + lVar18 * 2) = lVar28 * iVar20 + 1;
                lVar28 = ((long)iVar20 + 1) * lVar28;
                *(long *)((long)_hi + lVar18 * 2) = lVar28;
                lVar21 = *(long *)((long)GA[g_a + 1000].dims + lVar18 * 2);
                if (lVar21 <= lVar28) {
                  lVar28 = lVar21;
                }
                *(long *)((long)_hi + lVar18 * 2) = lVar28;
                lVar18 = lVar18 + 4;
              } while ((uVar30 & 0xffffffff) << 2 != lVar18);
            }
          }
          else if (iVar11 == 4) {
            uVar22 = (long)local_5a8 % GA[lVar25].num_blocks[0];
            _index[0] = (int)uVar22;
            if (1 < (short)uVar2) {
              uVar22 = uVar22 & 0xffffffff;
              lVar18 = 0;
              IVar15 = proc;
              do {
                IVar15 = (long)((int)IVar15 - (int)uVar22) / GA[g_a + 1000].num_blocks[lVar18];
                uVar22 = (long)(int)IVar15 % GA[g_a + 1000].num_blocks[lVar18 + 1];
                _index[lVar18 + 1] = (int)uVar22;
                lVar18 = lVar18 + 1;
              } while ((uVar30 & 0xffffffff) - 1 != lVar18);
            }
            if (0 < (short)uVar2) {
              pCVar7 = GA[lVar25].mapc;
              lVar18 = 0;
              iVar20 = 0;
              do {
                iVar17 = *(int *)((long)_index + lVar18);
                lVar28 = (long)iVar20 + (long)iVar17;
                *(C_Integer *)(err_string + lVar18 * 2) = pCVar7[lVar28];
                if ((long)iVar17 < *(long *)((long)GA[lVar25].num_blocks + lVar18 * 2) + -1) {
                  lVar28 = GA[lVar25].mapc[lVar28 + 1] + -1;
                }
                else {
                  lVar28 = *(long *)((long)GA[lVar25].dims + lVar18 * 2);
                }
                *(long *)((long)_hi + lVar18 * 2) = lVar28;
                iVar20 = iVar20 + *(int *)((long)GA[lVar25].num_blocks + lVar18 * 2);
                lVar18 = lVar18 + 4;
              } while ((uVar30 & 0xffffffff) << 2 != lVar18);
            }
          }
          else if (iVar11 == 0) {
            if (GA[lVar25].num_rstrctd == 0) {
              if ((short)uVar2 < 1) {
                lVar18 = 1;
              }
              else {
                lVar18 = 1;
                uVar22 = 0;
                do {
                  lVar18 = lVar18 * GA[g_a + 1000].nblock[uVar22];
                  uVar22 = uVar22 + 1;
                } while (uVar30 != uVar22);
              }
              if ((-1 < proc) && (proc < lVar18)) {
                if (0 < (short)uVar2) {
                  pCVar7 = GA[lVar25].mapc;
                  uVar22 = 0;
                  lVar18 = 0;
                  IVar15 = proc;
                  do {
                    lVar21 = (long)GA[g_a + 1000].nblock[uVar22];
                    lVar28 = IVar15 % lVar21;
                    hi_loc[uVar22 - 0x20] = pCVar7[lVar28 + lVar18];
                    if (lVar28 == lVar21 + -1) {
                      CVar24 = GA[g_a + 1000].dims[uVar22];
                    }
                    else {
                      CVar24 = pCVar7[lVar28 + lVar18 + 1] + -1;
                    }
                    lVar18 = lVar18 + lVar21;
                    _hi[uVar22] = CVar24;
                    uVar22 = uVar22 + 1;
                    IVar15 = IVar15 / lVar21;
                  } while (uVar30 != uVar22);
                }
                goto LAB_0017be66;
              }
            }
            else if (proc < GA[lVar25].num_rstrctd) {
              if ((short)uVar2 < 1) {
                lVar18 = 1;
              }
              else {
                lVar18 = 1;
                uVar22 = 0;
                do {
                  lVar18 = lVar18 * GA[g_a + 1000].nblock[uVar22];
                  uVar22 = uVar22 + 1;
                } while (uVar30 != uVar22);
              }
              if ((-1 < proc) && (proc < lVar18)) {
                if (0 < (short)uVar2) {
                  pCVar7 = GA[lVar25].mapc;
                  lVar18 = 0;
                  uVar22 = 0;
                  IVar15 = proc;
                  do {
                    lVar21 = (long)GA[g_a + 1000].nblock[uVar22];
                    lVar28 = IVar15 % lVar21;
                    hi_loc[uVar22 - 0x20] = pCVar7[lVar28 + lVar18];
                    if (lVar28 == lVar21 + -1) {
                      CVar24 = GA[g_a + 1000].dims[uVar22];
                    }
                    else {
                      CVar24 = pCVar7[lVar28 + lVar18 + 1] + -1;
                    }
                    lVar18 = lVar18 + lVar21;
                    _hi[uVar22] = CVar24;
                    uVar22 = uVar22 + 1;
                    IVar15 = IVar15 / lVar21;
                  } while (uVar30 != uVar22);
                }
                goto LAB_0017be66;
              }
            }
            if (0 < (short)uVar2) {
              memset(err_string,0,uVar30 * 8);
              memset(_hi,0xff,uVar30 * 8);
            }
          }
LAB_0017be66:
          if (uVar30 == 1) {
            ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar10[lVar25].width[0] * 2 + 1;
          }
          if ((short)uVar2 < 2) {
            lVar28 = 1;
            lVar18 = 0;
          }
          else {
            lVar28 = 1;
            lVar21 = 0;
            lVar18 = 0;
            do {
              lVar18 = lVar18 + plo_loc[lVar21] * lVar28;
              lVar26 = (_hi[lVar21] - hi_loc[lVar21 + -0x20]) +
                       pgVar10[g_a + 1000].width[lVar21] * 2 + 1;
              ld_loc[lVar21] = lVar26;
              lVar28 = lVar28 * lVar26;
              lVar21 = lVar21 + 1;
            } while (uVar30 - 1 != lVar21);
          }
          lVar21 = *(long *)(count + uVar30 * 2 + 6);
          ppcVar5 = pgVar10[lVar25].ptr;
          iVar20 = pgVar10[lVar25].elemsize;
          pcVar6 = ppcVar5[proc];
          local_5a0 = (int)proc_00;
          if (iVar11 - 1U < 3) {
            uVar22 = (long)local_5a0 % pgVar10[lVar25].num_blocks[0];
            _index[0] = (int)uVar22;
            if (1 < (short)uVar2) {
              uVar22 = uVar22 & 0xffffffff;
              lVar26 = 0;
              uVar16 = proc_00;
              do {
                uVar16 = (long)((int)uVar16 - (int)uVar22) / pgVar10[g_a + 1000].num_blocks[lVar26];
                uVar22 = (long)(int)uVar16 % pgVar10[g_a + 1000].num_blocks[lVar26 + 1];
                _index[lVar26 + 1] = (int)uVar22;
                lVar26 = lVar26 + 1;
              } while ((uVar30 & 0xffffffff) - 1 != lVar26);
            }
            if (0 < (short)uVar2) {
              lVar26 = 0;
              do {
                iVar11 = *(int *)((long)_index + lVar26);
                lVar23 = *(long *)((long)pgVar10[g_a + 1000].block_dims + lVar26 * 2);
                *(long *)(err_string + lVar26 * 2) = lVar23 * iVar11 + 1;
                lVar23 = ((long)iVar11 + 1) * lVar23;
                *(long *)((long)_hi + lVar26 * 2) = lVar23;
                lVar19 = *(long *)((long)pgVar10[g_a + 1000].dims + lVar26 * 2);
                if (lVar19 <= lVar23) {
                  lVar23 = lVar19;
                }
                *(long *)((long)_hi + lVar26 * 2) = lVar23;
                lVar26 = lVar26 + 4;
              } while ((uVar30 & 0xffffffff) << 2 != lVar26);
            }
          }
          else if (iVar11 == 4) {
            uVar22 = (long)local_5a0 % pgVar10[lVar25].num_blocks[0];
            _index[0] = (int)uVar22;
            if (1 < (short)uVar2) {
              uVar22 = uVar22 & 0xffffffff;
              lVar26 = 0;
              uVar16 = proc_00;
              do {
                uVar16 = (long)((int)uVar16 - (int)uVar22) / pgVar10[g_a + 1000].num_blocks[lVar26];
                uVar22 = (long)(int)uVar16 % pgVar10[g_a + 1000].num_blocks[lVar26 + 1];
                _index[lVar26 + 1] = (int)uVar22;
                lVar26 = lVar26 + 1;
              } while ((uVar30 & 0xffffffff) - 1 != lVar26);
            }
            if (0 < (short)uVar2) {
              pCVar7 = pgVar10[lVar25].mapc;
              lVar26 = 0;
              iVar11 = 0;
              do {
                iVar17 = *(int *)((long)_index + lVar26);
                lVar23 = (long)iVar11 + (long)iVar17;
                *(C_Integer *)(err_string + lVar26 * 2) = pCVar7[lVar23];
                if ((long)iVar17 < *(long *)((long)pgVar10[lVar25].num_blocks + lVar26 * 2) + -1) {
                  lVar23 = pgVar10[lVar25].mapc[lVar23 + 1] + -1;
                }
                else {
                  lVar23 = *(long *)((long)pgVar10[lVar25].dims + lVar26 * 2);
                }
                *(long *)((long)_hi + lVar26 * 2) = lVar23;
                iVar11 = iVar11 + *(int *)((long)pgVar10[lVar25].num_blocks + lVar26 * 2);
                lVar26 = lVar26 + 4;
              } while ((uVar30 & 0xffffffff) << 2 != lVar26);
            }
          }
          else if (iVar11 == 0) {
            if (pgVar10[lVar25].num_rstrctd == 0) {
              if ((short)uVar2 < 1) {
                lVar26 = 1;
              }
              else {
                lVar26 = 1;
                uVar22 = 0;
                do {
                  lVar26 = lVar26 * pgVar10[g_a + 1000].nblock[uVar22];
                  uVar22 = uVar22 + 1;
                } while (uVar30 != uVar22);
              }
              if (((long)proc_00 < 0) || (lVar26 <= (long)proc_00)) {
LAB_0017c2de:
                if (0 < (short)uVar2) {
                  memset(err_string,0,uVar30 << 3);
LAB_0017c311:
                  memset(_hi,0xff,uVar30 << 3);
                }
              }
              else if (0 < (short)uVar2) {
                pCVar7 = pgVar10[lVar25].mapc;
                lVar26 = 0;
                uVar16 = 0;
                uVar22 = proc_00;
                do {
                  lVar19 = (long)pgVar10[g_a + 1000].nblock[uVar16];
                  lVar23 = (long)uVar22 % lVar19;
                  hi_loc[uVar16 - 0x20] = pCVar7[lVar23 + lVar26];
                  if (lVar23 == lVar19 + -1) {
                    CVar24 = pgVar10[g_a + 1000].dims[uVar16];
                  }
                  else {
                    CVar24 = pCVar7[lVar23 + lVar26 + 1] + -1;
                  }
                  lVar26 = lVar26 + lVar19;
                  _hi[uVar16] = CVar24;
                  uVar16 = uVar16 + 1;
                  uVar22 = (long)uVar22 / lVar19;
                } while (uVar30 != uVar16);
              }
            }
            else if ((long)proc_00 < pgVar10[lVar25].num_rstrctd) {
              if ((short)uVar2 < 1) {
                lVar26 = 1;
              }
              else {
                lVar26 = 1;
                uVar22 = 0;
                do {
                  lVar26 = lVar26 * pgVar10[g_a + 1000].nblock[uVar22];
                  uVar22 = uVar22 + 1;
                } while (uVar30 != uVar22);
              }
              if (((long)proc_00 < 0) || (lVar26 <= (long)proc_00)) goto LAB_0017c2de;
              if (0 < (short)uVar2) {
                pCVar7 = pgVar10[lVar25].mapc;
                lVar26 = 0;
                uVar16 = 0;
                uVar22 = proc_00;
                do {
                  lVar19 = (long)pgVar10[g_a + 1000].nblock[uVar16];
                  lVar23 = (long)uVar22 % lVar19;
                  hi_loc[uVar16 - 0x20] = pCVar7[lVar23 + lVar26];
                  if (lVar23 == lVar19 + -1) {
                    CVar24 = pgVar10[g_a + 1000].dims[uVar16];
                  }
                  else {
                    CVar24 = pCVar7[lVar23 + lVar26 + 1] + -1;
                  }
                  lVar26 = lVar26 + lVar19;
                  _hi[uVar16] = CVar24;
                  uVar16 = uVar16 + 1;
                  uVar22 = (long)uVar22 / lVar19;
                } while (uVar30 != uVar16);
              }
            }
            else if (0 < (short)uVar2) {
              memset(err_string,0,(ulong)uVar2 << 3);
              goto LAB_0017c311;
            }
          }
          if (uVar30 == 1) {
            ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar10[lVar25].width[0] * 2 + 1;
          }
          if ((short)uVar2 < 2) {
            lVar23 = 1;
            lVar26 = 0;
          }
          else {
            lVar23 = 1;
            lVar26 = 0;
            lVar19 = 0;
            do {
              lVar26 = lVar26 + plo_rem[lVar19] * lVar23;
              lVar27 = (_hi[lVar19] - hi_loc[lVar19 + -0x20]) +
                       pgVar10[g_a + 1000].width[lVar19] * 2 + 1;
              ld_rem[lVar19] = lVar27;
              lVar23 = lVar23 * lVar27;
              lVar19 = lVar19 + 1;
            } while (uVar30 - 1 != lVar19);
          }
          lVar19 = plo_rem[uVar30 - 1];
          pcVar8 = ppcVar5[proc_00];
          stride_loc[0] = iVar3;
          stride_rem[0] = iVar3;
          if (1 < sVar1) {
            lVar27 = 0;
            iVar11 = iVar3;
            iVar17 = iVar3;
            do {
              iVar17 = iVar17 * (int)ld_rem[lVar27];
              stride_rem[lVar27] = iVar17;
              iVar11 = iVar11 * (int)ld_loc[lVar27];
              stride_loc[lVar27] = iVar11;
              stride_rem[lVar27 + 1] = iVar17;
              stride_loc[lVar27 + 1] = iVar11;
              lVar27 = lVar27 + 1;
            } while (lVar31 + -1 != lVar27);
          }
          if (0 < sVar1) {
            lVar27 = 0;
            do {
              count[lVar27] = ((int)phi_loc[lVar27] - (int)plo_loc[lVar27]) + 1;
              lVar27 = lVar27 + 1;
            } while (lVar31 != lVar27);
          }
          count[0] = count[0] * iVar3;
          if (-1 < iVar4) {
            proc_00 = (ulong)(uint)PGRP_LIST[iVar4].inv_map_proc_list[proc_00];
          }
          ARMCI_NbPutS(pcVar6 + (lVar28 * lVar21 + lVar18) * (long)iVar20,stride_loc,
                       pcVar8 + (lVar23 * lVar19 + lVar26) * (long)iVar20,stride_rem,count,
                       (int)(lVar31 + -1),(int)proc_00,(armci_hdl_t *)0x0);
        }
      }
LAB_0017c4ef:
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar29 + (ulong)(lVar29 == 0));
    ARMCI_WaitAll();
    free(map);
    free(proclist);
  }
  return 1;
}

Assistant:

logical pnga_update2_ghosts(Integer g_a)
{
  Integer idx, ipx, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer ntot, mask[MAXDIM];
  Integer size, ndim, i, itmp;
  Integer width[MAXDIM], dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  /*Integer tlo_loc[MAXDIM], thi_loc[MAXDIM];*/
  Integer plo_loc[MAXDIM], phi_loc[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer plo_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  logical mask0;
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) {
    return TRUE;
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater than
     the corresponding value in width[]). */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM +1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update2_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update2_ghosts:malloc failed (_ga_proclist)",0);
  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  /* initialize ghost cell widths and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* evaluate total number of PUT operations that will be required */
  ntot = 1;
  for (idx=0; idx < ndim; idx++) ntot *= 3;

  /* Loop over all PUT operations. The operation corresponding to the
     mask of all zeros is left out. */
  for (ipx=0; ipx < ntot; ipx++) {
    /* Convert ipx to corresponding mask values */
    itmp = ipx;
    mask0 = TRUE;
    for (idx = 0; idx < ndim; idx++) {
      i = itmp%3;
      mask[idx] = i-1;
      if (mask[idx] != 0) mask0 = FALSE;
      itmp = (itmp-i)/3;
    }
    if (mask0) continue;

    /* check to see if ghost cell block has zero elements*/
    mask0 = FALSE;
    itmp = 0;
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] != 0 && width[idx] == 0) mask0 = TRUE;
      if (mask[idx] != 0) itmp++;
    }
    /*if (itmp>1) mask0 = TRUE; */
    if (mask0) continue;
    /* Now that mask has been determined, find data that is to be moved
     * and identify processor to which it is going. Wrap boundaries
     * around, if necessary */
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        /*tlo_loc[idx] = lo_loc[idx];*/
        /*thi_loc[idx] = hi_loc[idx];*/
        tlo_rem[idx] = lo_loc[idx];
        thi_rem[idx] = hi_loc[idx];
      } else if (mask[idx] == -1) {
        /*tlo_loc[idx] = lo_loc[idx];*/
        /*thi_loc[idx] = lo_loc[idx]+width[idx]-1;*/
        if (lo_loc[idx] > 1) {
          tlo_rem[idx] = lo_loc[idx]-width[idx];
          thi_rem[idx] = lo_loc[idx]-1;
        } else {
          tlo_rem[idx] = dims[idx]-width[idx]+1;
          thi_rem[idx] = dims[idx];
        }
      } else if (mask[idx] == 1) {
        /*tlo_loc[idx] = hi_loc[idx]-width[idx]+1;*/
        /*thi_loc[idx] = hi_loc[idx];*/
        if (hi_loc[idx] < dims[idx]) {
          tlo_rem[idx] = hi_loc[idx] + 1;
          thi_rem[idx] = hi_loc[idx] + width[idx];
        } else {
          tlo_rem[idx] = 1;
          thi_rem[idx] = width[idx];
        }
      } else {
        fprintf(stderr,"Illegal mask value found\n");
      }
    }
    /* Locate remote processor to which data must be sent */
    if (!pnga_locate_region(g_a, tlo_rem, thi_rem, _ga_map,
       _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
       tlo_rem, thi_rem, g_a);
    if (np > 1) {
      fprintf(stderr,"More than one remote processor found\n");
    }
    /* Remote processor has been identified, now get ready to send
       data to it. Start by getting distribution on remote
       processor.*/
    proc_rem = _ga_proclist[0];
    pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = plo_loc[idx];
      } else if (mask[idx] == -1) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = 2*width[idx]-1;
        plo_rem[idx] = thi_rem[idx]-tlo_rem[idx]+width[idx]+1;
      } else if (mask[idx] == 1) {
        plo_loc[idx] = hi_loc[idx]-lo_loc[idx]+1;
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = 0;
      }
    }
    /* Get pointer to local data buffer and remote data
       buffer as well as lists of leading dimenstions */
    gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
    gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

    /* Evaluate strides on local and remote processors */
    gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
                  stride_loc);

    /* Compute the number of elements in each dimension and store
       result in count. Scale the first element in count by the
       element size. */
    gam_ComputeCount(ndim, plo_loc, phi_loc, count);
    count[0] *= size;
 
    /* put data on remote processor */
    /*ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem);*/
    if (p_handle >= 0) {
      proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
    }
    ARMCI_NbPutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem, NULL); 
  }

  ARMCI_WaitAll();
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}